

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O0

int __thiscall CmdOpts::parse(CmdOpts *this)

{
  int iVar1;
  char **ppcVar2;
  string *this_00;
  CmdOpts *pCVar3;
  char *pcVar4;
  char letter;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char acStack_80 [8];
  char acStack_78 [12];
  ArgType local_6c;
  bool local_65;
  ArgHas local_64;
  CmdOpts *local_60;
  char *local_58;
  char *local_50;
  int local_40;
  int local_3c;
  int rc;
  int optIdx;
  char *optPtr;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  CmdOpts *local_18;
  CmdOpts *this_local;
  
  __vla_expr0 = (unsigned_long)acStack_78;
  __vla_expr1 = (unsigned_long)(this->_numOpts + 1);
  local_58 = acStack_78 + __vla_expr1 * -0x20;
  optPtr = (char *)(ulong)(this->_numOpts * 3 + 1);
  pcVar5 = local_58 + -((ulong)(optPtr + 0xf) & 0xfffffffffffffff0);
  local_3c = 0;
  local_60 = this;
  local_50 = pcVar5;
  _rc = pcVar5;
  local_18 = this;
  do {
    pcVar7 = local_58;
    pCVar3 = local_60;
    if (local_60->_numOpts <= local_3c) {
      pcVar7 = local_58 + (long)local_60->_numOpts * 0x20;
      pcVar5[-8] = -0x1c;
      pcVar5[-7] = -0x3e;
      pcVar5[-6] = '\x11';
      pcVar5[-5] = '\0';
      pcVar5[-4] = '\0';
      pcVar5[-3] = '\0';
      pcVar5[-2] = '\0';
      pcVar5[-1] = '\0';
      memset(pcVar7,0,0x20);
      *_rc = '\0';
      local_3c = 0;
      while( true ) {
        pcVar4 = local_50;
        pcVar7 = local_58;
        iVar1 = local_60->_argc;
        ppcVar2 = local_60->_argv;
        pcVar5[-8] = '\x0e';
        pcVar5[-7] = -0x3d;
        pcVar5[-6] = '\x11';
        pcVar5[-5] = '\0';
        pcVar5[-4] = '\0';
        pcVar5[-3] = '\0';
        pcVar5[-2] = '\0';
        pcVar5[-1] = '\0';
        local_40 = getopt_long(iVar1,ppcVar2,pcVar4,pcVar7,&local_3c);
        pCVar3 = local_60;
        if (local_40 == -1) {
          return _optind;
        }
        if (local_40 == 0x3f) break;
        if (local_40 != 0) {
          letter = (char)local_40;
          pcVar5[-8] = 'H';
          pcVar5[-7] = -0x3d;
          pcVar5[-6] = '\x11';
          pcVar5[-5] = '\0';
          pcVar5[-4] = '\0';
          pcVar5[-3] = '\0';
          pcVar5[-2] = '\0';
          pcVar5[-1] = '\0';
          local_3c = find(pCVar3,letter);
        }
        local_65 = false;
        if (-1 < local_3c) {
          local_65 = local_3c < local_60->_numOpts;
        }
        if (local_65 == false) {
          pcVar5[-8] = -0x70;
          pcVar5[-7] = -0x3d;
          pcVar5[-6] = '\x11';
          pcVar5[-5] = '\0';
          pcVar5[-4] = '\0';
          pcVar5[-3] = '\0';
          pcVar5[-2] = '\0';
          pcVar5[-1] = '\0';
          __assert_fail("optIdx >= 0 && optIdx < _numOpts",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/CmdOpts.cpp"
                        ,0x81,"int CmdOpts::parse()");
        }
        *local_60->_opts[local_3c].present = true;
        if ((local_60->_opts[local_3c].arg.has != ArgNone) && (_optarg != (char *)0x0)) {
          local_6c = local_60->_opts[local_3c].arg.type;
          if (local_6c == ArgInt) {
            pcVar5[-8] = '\x10';
            pcVar5[-7] = -0x3c;
            pcVar5[-6] = '\x11';
            pcVar5[-5] = '\0';
            pcVar5[-4] = '\0';
            pcVar5[-3] = '\0';
            pcVar5[-2] = '\0';
            pcVar5[-1] = '\0';
            lVar6 = strtol(_optarg,(char **)0x0,0);
            *local_60->_opts[local_3c].arg.value.intPtr = (int)lVar6;
          }
          else {
            this_00 = local_60->_opts[local_3c].arg.value.strPtr;
            pcVar5[-8] = 'V';
            pcVar5[-7] = -0x3c;
            pcVar5[-6] = '\x11';
            pcVar5[-5] = '\0';
            pcVar5[-4] = '\0';
            pcVar5[-3] = '\0';
            pcVar5[-2] = '\0';
            pcVar5[-1] = '\0';
            std::__cxx11::string::operator=((string *)this_00,_optarg);
          }
        }
      }
      return -1;
    }
    *local_60->_opts[local_3c].present = false;
    pcVar4 = _rc + 1;
    *_rc = local_60->_opts[local_3c].letter;
    _rc = pcVar4;
    *(char **)(pcVar7 + (long)local_3c * 0x20) = pCVar3->_opts[local_3c].name;
    local_64 = pCVar3->_opts[local_3c].arg.has;
    if (local_64 == ArgNone) {
LAB_0011c20f:
      pcVar7 = local_58 + (long)local_3c * 0x20 + 8;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
    }
    else if (local_64 == ArgOptional) {
      pcVar7 = local_58 + (long)local_3c * 0x20 + 8;
      pcVar7[0] = '\x02';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7 = _rc + 1;
      *_rc = ':';
      _rc = pcVar7;
      pcVar7 = _rc + 1;
      *_rc = ':';
      _rc = pcVar7;
    }
    else {
      if (local_64 != ArgRequired) goto LAB_0011c20f;
      pcVar7 = local_58 + (long)local_3c * 0x20 + 8;
      pcVar7[0] = '\x01';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7 = _rc + 1;
      *_rc = ':';
      _rc = pcVar7;
    }
    pcVar7 = local_58 + (long)local_3c * 0x20 + 0x10;
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7 = local_58 + (long)local_3c * 0x20 + 0x18;
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int
CmdOpts::parse()
{
    struct option long_opts[_numOpts + 1];
    char optstring[_numOpts * 3 + 1];
    char* optPtr = optstring;
    int optIdx;
    int rc;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
    {
        *_opts[optIdx].present = false;

        *optPtr++ = _opts[optIdx].letter;
        long_opts[optIdx].name = _opts[optIdx].name;
        switch (_opts[optIdx].arg.has)
        {
        default:
        case ArgNone:
            long_opts[optIdx].has_arg = no_argument;
            break;
        case ArgOptional:
            long_opts[optIdx].has_arg = optional_argument;
            *optPtr++ = ':';
            *optPtr++ = ':';
            break;
        case ArgRequired:
            long_opts[optIdx].has_arg = required_argument;
            *optPtr++ = ':';
            break;
        }
        long_opts[optIdx].flag = NULL;
        long_opts[optIdx].val = 0;
    }

    memset(&long_opts[_numOpts], 0, sizeof(long_opts[_numOpts]));
    *optPtr = '\0';
    optIdx = 0;
    while ((rc = getopt_long(_argc, _argv, optstring, long_opts, &optIdx)) != -1)
    {
        if (rc == '?')
            return -1;

        if (rc != 0)
           optIdx = find(rc);

        assert(optIdx >= 0 && optIdx < _numOpts);
        *_opts[optIdx].present = true;
        if (_opts[optIdx].arg.has != ArgNone && optarg)
        {
            switch (_opts[optIdx].arg.type)
            {
            case ArgInt:
                *_opts[optIdx].arg.value.intPtr = strtol(optarg, NULL, 0);
                break;
            default:
            case ArgString:
                *_opts[optIdx].arg.value.strPtr = optarg;
                break;
            }
        }
    }

    return optind;
}